

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

Cord * __thiscall
google::protobuf::RepeatedField<absl::lts_20240722::Cord>::elements
          (RepeatedField<absl::lts_20240722::Cord> *this,bool is_soo)

{
  int iVar1;
  int v2;
  LogMessage *pLVar2;
  Cord *pCVar3;
  undefined1 auVar4 [16];
  LogMessageFatal local_38 [23];
  Voidify local_21;
  string *local_20;
  string *absl_log_internal_check_op_result;
  RepeatedField<absl::lts_20240722::Cord> *pRStack_10;
  bool is_soo_local;
  RepeatedField<absl::lts_20240722::Cord> *this_local;
  
  absl_log_internal_check_op_result._7_1_ = is_soo;
  pRStack_10 = this;
  iVar1 = Capacity(this,is_soo);
  iVar1 = absl::lts_20240722::log_internal::GetReferenceableValue(iVar1);
  v2 = absl::lts_20240722::log_internal::GetReferenceableValue(0);
  local_20 = absl::lts_20240722::log_internal::Check_GTImpl_abi_cxx11_
                       (iVar1,v2,"Capacity(is_soo) > 0");
  if (local_20 != (string *)0x0) {
    auVar4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_20);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0x246,auVar4._0_8_,auVar4._8_8_);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_38);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_21,pLVar2);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
  }
  pCVar3 = unsafe_elements(this,(bool)(absl_log_internal_check_op_result._7_1_ & 1));
  return pCVar3;
}

Assistant:

Element* elements(bool is_soo) {
    ABSL_DCHECK_GT(Capacity(is_soo), 0);
    return unsafe_elements(is_soo);
  }